

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

void __thiscall TestSuite::doTest(TestSuite *this,string *test_name,test_func *func)

{
  bool bVar1;
  int result;
  string *psVar2;
  
  bVar1 = matchFilter(this,test_name);
  if (bVar1) {
    readyTest(this,test_name);
    psVar2 = getResMsg_abi_cxx11_();
    std::__cxx11::string::assign((char *)psVar2);
    psVar2 = getInfoMsg_abi_cxx11_();
    std::__cxx11::string::assign((char *)psVar2);
    getCurTest()::cur_test = this;
    result = std::function<int_()>::operator()(func);
    reportTestResult(this,test_name,result);
    return;
  }
  return;
}

Assistant:

void doTest( const std::string& test_name,
                 test_func func )
    {
        if (!matchFilter(test_name)) return;

        readyTest(test_name);
        TestSuite::getResMsg() = "";
        TestSuite::getInfoMsg() = "";
        TestSuite::getCurTest() = this;
        int ret = func();
        reportTestResult(test_name, ret);
    }